

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_fsa.c
# Opt level: O2

void soa_fsa_free(soa_fsa_t *allocator,void *ptr)

{
  soa_chunk_t *chunk;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  
  chunk = allocator->deallocChunk;
  lVar1 = (ulong)allocator->numBlocks * allocator->blockSize;
  if (chunk != (soa_chunk_t *)0x0) {
    if ((chunk->blockData <= ptr) && (ptr <= chunk->blockData + lVar1)) goto LAB_00103114;
    allocator->deallocChunk = (soa_chunk_t *)0x0;
  }
  chunk = allocator->chunks;
  sVar2 = allocator->chunks_len;
  while( true ) {
    bVar3 = sVar2 == 0;
    sVar2 = sVar2 - 1;
    if (bVar3) {
      __assert_fail("allocator->deallocChunk",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_fsa.c"
                    ,0x84,"void soa_fsa_free(soa_fsa_t *, void *)");
    }
    if ((chunk->blockData <= ptr) && (ptr <= chunk->blockData + lVar1)) break;
    chunk = chunk + 1;
  }
  allocator->deallocChunk = chunk;
LAB_00103114:
  soa_chunk_free(chunk,ptr,allocator->blockSize);
  return;
}

Assistant:

void soa_fsa_free( soa_fsa_t *allocator, void* ptr )
{
  size_t chunkSizeBytes = allocator->blockSize*allocator->numBlocks;
  unsigned char *a, *b; //[a..b] is a (memory) range, where a is the first byte, and b is the last byte (in the range)
  unsigned char *p = (unsigned char*) ptr;
  
  if(allocator->deallocChunk) //Is this deallocation in the same chunk as last time?
  {
    a = allocator->deallocChunk->blockData;
    b = allocator->deallocChunk->blockData+chunkSizeBytes;
    if( (a <= p) && (p<=b)) //Does p fall in the range [a..b]?
    {
      //Do nothing (deallocChunk is valid)
    }
    else
    {
      allocator->deallocChunk = 0; //invalidate deallocChunk
    }
  }
  if(allocator->deallocChunk == 0)
  {
    //which chunk does p belong to? (linear search)
    size_t i;
    soa_chunk_t *chunk;
    for(i=0,chunk=allocator->chunks;i<allocator->chunks_len;i++,chunk++)
    {
      a = chunk->blockData;
      b = chunk->blockData+chunkSizeBytes;
      if( (a <= p) && (p<=b)) //Does p fall in the range [a..b]?
      {
        //Found it!
        allocator->deallocChunk = chunk;
        break;
      }
    }
  }
  assert(allocator->deallocChunk); //If this fails it means that ptr did not originate from this allocator
  soa_chunk_free(allocator->deallocChunk,ptr,allocator->blockSize);
}